

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O1

void __thiscall flexbuffers::Builder::Bool(Builder *this,bool b)

{
  pointer *ppVVar1;
  iterator __position;
  undefined7 in_register_00000031;
  anon_union_8_3_83789bcb_for_Value_0 local_10;
  undefined8 uStack_8;
  
  local_10.u_ = CONCAT71(in_register_00000031,b) & 0xffffffff;
  uStack_8 = 0x1a;
  __position._M_current =
       (this->stack_).
       super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->stack_).
      super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>::
    _M_realloc_insert<flexbuffers::Builder::Value>(&this->stack_,__position,(Value *)&local_10);
  }
  else {
    ((__position._M_current)->field_0).u_ = (uint64_t)local_10;
    (__position._M_current)->type_ = FBT_BOOL;
    (__position._M_current)->min_bit_width_ = BIT_WIDTH_8;
    ppVVar1 = &(this->stack_).
               super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppVVar1 = *ppVVar1 + 1;
  }
  return;
}

Assistant:

void Bool(bool b) { stack_.push_back(Value(b)); }